

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::setTranslatorOperator
          (CommonCore *this,InterfaceHandle translator,
          shared_ptr<helics::TranslatorOperator> *callbacks)

{
  uint16_t uVar1;
  int iVar2;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
  *p_Var3;
  InvalidIdentifier *this_00;
  char *pcVar4;
  string_view message;
  size_t sStack_f0;
  ActionMessage transOpUpdate;
  
  if (setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)::
      nullTranslator == '\0') {
    iVar2 = __cxa_guard_acquire(&setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)
                                 ::nullTranslator);
    if (iVar2 != 0) {
      std::make_shared<helics::NullTranslatorOperator>();
      setTranslatorOperator::nullTranslator.
      super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           transOpUpdate.messageID;
      setTranslatorOperator::nullTranslator.
      super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
           transOpUpdate.messageAction;
      setTranslatorOperator::nullTranslator.
      super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _0_4_ = transOpUpdate.source_id.gid;
      setTranslatorOperator::nullTranslator.
      super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = transOpUpdate.source_handle.hid;
      transOpUpdate.messageAction = cmd_ignore;
      transOpUpdate.messageID = 0;
      transOpUpdate.source_id.gid = 0;
      transOpUpdate.source_handle.hid = 0;
      CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&transOpUpdate.source_id);
      __cxa_atexit(std::__shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>::
                   ~__shared_ptr,&setTranslatorOperator::nullTranslator,&__dso_handle);
      __cxa_guard_release(&setTranslatorOperator(helics::InterfaceHandle,std::shared_ptr<helics::TranslatorOperator>)
                           ::nullTranslator);
    }
  }
  p_Var3 = getHandleInfo(this,translator);
  if (p_Var3 == (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
                 *)0x0) {
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar4 = "translator handle is not valid";
    sStack_f0 = 0x1e;
  }
  else {
    if ((p_Var3->
        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>,_true>
        ).
        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_spdlog::level::level_enum>_>
        ._M_storage._M_storage.__data[4] == 't') {
      ActionMessage::ActionMessage(&transOpUpdate,cmd_core_configure);
      transOpUpdate.messageID = 0x23e;
      if ((callbacks->super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr == (element_type *)0x0) {
        std::__shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&callbacks->
                    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>,
                   &setTranslatorOperator::nullTranslator.
                    super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>);
      }
      uVar1 = getNextAirlockIndex(this);
      gmlc::containers::AirLock<std::any,std::mutex,std::condition_variable>::
      load<std::shared_ptr<helics::TranslatorOperator>>
                ((AirLock<std::any,std::mutex,std::condition_variable> *)
                 ((this->dataAirlocks)._M_elems + uVar1),callbacks);
      transOpUpdate.source_id.gid = *(BaseType *)&(p_Var3->super__Hash_node_base)._M_nxt;
      transOpUpdate.source_handle.hid = translator.hid;
      transOpUpdate.counter = uVar1;
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
      push<helics::ActionMessage&>
                ((BlockingPriorityQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                 &(this->super_BrokerBase).actionQueue,&transOpUpdate);
      ActionMessage::~ActionMessage(&transOpUpdate);
      return;
    }
    this_00 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar4 = "translator identifier does not point to a valid translator";
    sStack_f0 = 0x3a;
  }
  message._M_str = pcVar4;
  message._M_len = sStack_f0;
  InvalidIdentifier::InvalidIdentifier(this_00,message);
  __cxa_throw(this_00,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::setTranslatorOperator(InterfaceHandle translator,
                                       std::shared_ptr<TranslatorOperator> callbacks)
{
    static const std::shared_ptr<TranslatorOperator> nullTranslator =
        std::make_shared<NullTranslatorOperator>();
    const auto* hndl = getHandleInfo(translator);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("translator handle is not valid"));
    }
    if ((hndl->handleType != InterfaceType::TRANSLATOR)) {
        throw(InvalidIdentifier("translator identifier does not point to a valid translator"));
    }
    ActionMessage transOpUpdate(CMD_CORE_CONFIGURE);
    transOpUpdate.messageID = UPDATE_TRANSLATOR_OPERATOR;
    if (!callbacks) {
        callbacks = nullTranslator;
    }
    auto index = getNextAirlockIndex();
    dataAirlocks[index].load(std::move(callbacks));
    transOpUpdate.counter = index;
    transOpUpdate.source_id = hndl->getFederateId();
    transOpUpdate.source_handle = translator;
    actionQueue.push(transOpUpdate);
}